

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O2

void __thiscall
jetbrains::teamcity::anon_unknown_1::RaiiMessage::writeProperty
          (RaiiMessage *this,char *name,string *value)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  char local_79;
  ostream *local_78;
  long local_70;
  ulong local_68;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  poVar1 = std::operator<<(this->m_out,' ');
  poVar1 = std::operator<<(poVar1,name);
  local_78 = std::operator<<(poVar1,"=\'");
  std::__cxx11::string::string((string *)&local_70,(string *)value);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  for (uVar2 = 0; uVar2 < local_68; uVar2 = uVar2 + 1) {
    local_79 = *(char *)(local_70 + uVar2);
    if ((((local_79 == '|') || (local_79 == '\r')) || (local_79 == '\'')) ||
       ((local_79 == ']' || (local_79 == '\n')))) {
      std::__cxx11::string::append((char *)&local_50);
    }
    else {
      std::__cxx11::string::append((char *)&local_50,(ulong)&local_79);
    }
  }
  poVar1 = std::operator<<(local_78,(string *)&local_50);
  std::operator<<(poVar1,'\'');
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void writeProperty(const char* const name, const std::string value)
    {
        m_out << ' ' << name << "='" << escape(value) << '\'';
    }